

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft.c
# Opt level: O3

t_int * sigframp_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  pfVar4 = (float *)w[1];
  pfVar5 = (float *)w[2];
  puVar6 = (undefined4 *)w[3];
  puVar7 = (undefined4 *)w[4];
  fVar14 = *pfVar4;
  fVar1 = pfVar4[1];
  fVar16 = *pfVar5;
  fVar2 = pfVar5[1];
  iVar3 = (int)w[5];
  *puVar6 = 0;
  *puVar7 = 0;
  puVar7 = puVar7 + 1;
  puVar6 = puVar6 + 1;
  if (iVar3 != 2) {
    iVar8 = iVar3 + -2;
    lVar9 = 0;
    fVar15 = 1.0;
    do {
      fVar11 = fVar2;
      fVar10 = fVar1;
      fVar1 = *(float *)((long)pfVar4 + lVar9 + 8);
      fVar2 = *(float *)((long)pfVar5 + lVar9 + 8);
      fVar18 = (fVar14 + fVar1) * -0.5 + fVar10;
      fVar19 = (fVar16 + fVar2) * -0.5 + fVar11;
      fVar17 = fVar18 * fVar18 + fVar19 * fVar19;
      fVar13 = 0.0;
      fVar12 = 0.0;
      if (1e-19 < fVar17) {
        fVar14 = ((fVar14 - fVar1) * fVar18 + (fVar16 - fVar2) * fVar19) / (fVar17 + fVar17);
        fVar16 = ABS(fVar14);
        fVar12 = 0.0;
        if (fVar16 <= 2.0) {
          fVar12 = fVar14 + fVar15;
        }
        fVar13 = (float)(~-(uint)(2.0 < fVar16) & (uint)fVar17);
      }
      *(float *)((long)puVar6 + lVar9) = fVar12;
      *(float *)((long)puVar7 + lVar9) = fVar13 * (1.0 / ((float)iVar3 * (float)iVar3));
      fVar15 = fVar15 + 1.0;
      lVar9 = lVar9 + 4;
      iVar8 = iVar8 + -1;
      fVar14 = fVar10;
      fVar16 = fVar11;
    } while (iVar8 != 0);
    if (iVar3 == -1) goto LAB_0011bf03;
    puVar6 = (undefined4 *)((long)puVar6 + lVar9);
    puVar7 = (undefined4 *)((long)puVar7 + lVar9);
  }
  lVar9 = 0;
  do {
    puVar6[lVar9] = 0;
    puVar7[lVar9] = 0;
    lVar9 = lVar9 + 1;
  } while (iVar3 + 1 != (int)lVar9);
LAB_0011bf03:
  return w + 6;
}

Assistant:

static t_int *sigframp_perform(t_int *w)
{
    t_sample *inreal = (t_sample *)(w[1]);
    t_sample *inimag = (t_sample *)(w[2]);
    t_sample *outfreq = (t_sample *)(w[3]);
    t_sample *outamp = (t_sample *)(w[4]);
    t_sample lastreal = 0, currentreal = inreal[0], nextreal = inreal[1];
    t_sample lastimag = 0, currentimag = inimag[0], nextimag = inimag[1];
    int n = (int)w[5];
    int m = n + 1;
    t_sample fbin = 1, oneovern2 = 1.f/((t_sample)n * (t_sample)n);

    inreal += 2;
    inimag += 2;
    *outamp++ = *outfreq++ = 0;
    n -= 2;
    while (n--)
    {
        t_sample re, im, pow, freq;
        lastreal = currentreal;
        currentreal = nextreal;
        nextreal = *inreal++;
        lastimag = currentimag;
        currentimag = nextimag;
        nextimag = *inimag++;
        re = currentreal - 0.5f * (lastreal + nextreal);
        im = currentimag - 0.5f * (lastimag + nextimag);
        pow = re * re + im * im;
        if (pow > 1e-19)
        {
            t_sample detune = ((lastreal - nextreal) * re +
                    (lastimag - nextimag) * im) / (2.0f * pow);
            if (detune > 2 || detune < -2) freq = pow = 0;
            else freq = fbin + detune;
        }
        else freq = pow = 0;
        *outfreq++ = freq;
        *outamp++ = oneovern2 * pow;
        fbin += 1.0f;
    }
    while (m--) *outamp++ = *outfreq++ = 0;
    return (w+6);
}